

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
getLocalOptionType(HighsLogOptions *report_log_options,string *option,
                  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                  HighsOptionType *type)

{
  const_reference ppOVar1;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RCX;
  string *in_RDX;
  HighsLogOptions *in_RSI;
  OptionStatus status;
  HighsInt index;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  OptionStatus local_4;
  
  local_4 = getOptionIndex(in_RSI,in_RDX,in_RCX,
                           (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                          );
  if (local_4 == kOk) {
    if (in_RCX != (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)0x0) {
      ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)in_RDX,
                           (long)in_stack_ffffffffffffffd4);
      *(HighsOptionType *)
       &(in_RCX->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
        super__Vector_impl_data._M_start = (*ppOVar1)->type;
    }
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

OptionStatus getLocalOptionType(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records, HighsOptionType* type) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  if (type) *type = option_records[index]->type;
  return OptionStatus::kOk;
}